

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O2

int determineAsn1IntLength(uint8_t *integer)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if ((char)*integer < '\0') {
    iVar3 = 0x21;
  }
  else {
    iVar4 = 0x20;
    lVar5 = 1;
    bVar2 = *integer;
    while ((iVar3 = 1, lVar5 != 0x20 &&
           (pbVar1 = integer + lVar5, iVar3 = iVar4, (*pbVar1 & 0x80) == 0 && bVar2 == 0))) {
      iVar4 = iVar4 + -1;
      lVar5 = lVar5 + 1;
      bVar2 = *pbVar1;
    }
  }
  return iVar3;
}

Assistant:

static int
determineAsn1IntLength(const uint8_t* integer)
{
  if ((integer[0] & 0x80) != 0x00) {
    return 33;
  }

  int len = 32;
  for (int i = 0; i < 31; ++i) {
    if ((((uint16_t)(integer[i]) << 8) | (integer[i + 1] & 0x80)) != 0x0000) {
      break;
    }
    --len;
  }
  return len;
}